

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void FM::OPNB::InitADPCMATable(void)

{
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined6 uVar5;
  undefined1 auVar6 [12];
  uint uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  undefined1 *puVar10;
  double dVar11;
  undefined1 auVar12 [16];
  short sVar13;
  int iVar20;
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  int iVar21;
  int iVar22;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 uVar18;
  undefined2 uVar19;
  
  puVar10 = jedi_table;
  uVar9 = 0;
  do {
    dVar11 = (double)__powidf2(0x3ff199999999999a,uVar9 & 0xffffffff);
    uVar7 = (uint)(dVar11 * 16.0 * 3.0);
    auVar12._4_4_ = uVar7;
    auVar12._0_4_ = uVar7;
    auVar12._8_4_ = uVar7;
    auVar12._12_4_ = uVar7;
    lVar8 = 0;
    do {
      uVar2 = *(undefined4 *)(InitADPCMATable::table2 + lVar8);
      uVar18 = (undefined1)((uint)uVar2 >> 0x18);
      uVar19 = CONCAT11(uVar18,uVar18);
      uVar18 = (undefined1)((uint)uVar2 >> 0x10);
      uVar3 = CONCAT35(CONCAT21(uVar19,uVar18),CONCAT14(uVar18,uVar2));
      uVar18 = (undefined1)((uint)uVar2 >> 8);
      uVar5 = CONCAT51(CONCAT41((int)((ulong)uVar3 >> 0x20),uVar18),uVar18);
      sVar13 = CONCAT11((char)uVar2,(char)uVar2);
      uVar4 = CONCAT62(uVar5,sVar13);
      auVar16._8_4_ = 0;
      auVar16._0_8_ = uVar4;
      auVar16._12_2_ = uVar19;
      auVar16._14_2_ = uVar19;
      uVar19 = (undefined2)((ulong)uVar3 >> 0x20);
      auVar15._12_4_ = auVar16._12_4_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar4;
      auVar15._10_2_ = uVar19;
      auVar14._10_6_ = auVar15._10_6_;
      auVar14._8_2_ = uVar19;
      auVar14._0_8_ = uVar4;
      uVar19 = (undefined2)uVar5;
      auVar6._4_8_ = auVar14._8_8_;
      auVar6._2_2_ = uVar19;
      auVar6._0_2_ = uVar19;
      auVar17._4_4_ = auVar6._0_4_ >> 0x18;
      auVar17._12_4_ = auVar15._12_4_ >> 0x18;
      iVar21 = uVar7 * ((int)sVar13 >> 8);
      iVar22 = (int)((auVar12._8_8_ & 0xffffffff) * (ulong)(uint)(auVar14._8_4_ >> 0x18));
      auVar17._0_4_ = auVar17._4_4_;
      auVar17._8_4_ = auVar17._12_4_;
      iVar20 = (int)((auVar17._8_8_ & 0xffffffff) * (ulong)uVar7);
      piVar1 = (int *)(puVar10 + lVar8 * 4);
      *piVar1 = (int)(((uint)(iVar21 >> 0x1f) >> 0x1d) + iVar21) >> 3;
      piVar1[1] = (int)(((uint)((int)(auVar17._4_4_ * uVar7) >> 0x1f) >> 0x1d) +
                       auVar17._4_4_ * uVar7) >> 3;
      piVar1[2] = (int)(((uint)(iVar22 >> 0x1f) >> 0x1d) + iVar22) >> 3;
      piVar1[3] = (int)(((uint)(iVar20 >> 0x1f) >> 0x1d) + iVar20) >> 3;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x10);
    uVar9 = uVar9 + 1;
    puVar10 = puVar10 + 0x40;
  } while (uVar9 != 0x31);
  return;
}

Assistant:

void OPNB::InitADPCMATable()
{
	const static int8 table2[] =
	{
		 1,  3,  5,  7,  9, 11, 13, 15,
		-1, -3, -5, -7, -9,-11,-13,-15,
	};

	for (int i=0; i<=48; i++)
	{
		int s = int(16.0 * pow (1.1, i) * 3);
		for (int j=0; j<16; j++)
		{
			jedi_table[i*16+j] = s * table2[j] / 8;
		}
	}
}